

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O0

FilterHandle
pbrt::FilterHandle::Create
          (string *name,ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  GaussianFilter *in_RDI;
  char *in_R8;
  FileLoc *in_stack_00000010;
  ParameterDictionary *in_stack_00000018;
  Allocator in_stack_00000020;
  FileLoc *in_stack_00000050;
  ParameterDictionary *in_stack_00000058;
  FilterHandle *filter;
  FileLoc *in_stack_00000090;
  ParameterDictionary *in_stack_00000098;
  Allocator in_stack_000000a0;
  ParameterDictionary *in_stack_00000150;
  TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
  __lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  FileLoc *in_stack_ffffffffffffffc0;
  
  __lhs.bits = (uintptr_t)in_RDI;
  TaggedPointer((FilterHandle *)in_RDI,in_RDI);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          __lhs.bits,(char *)in_RDI);
  if (bVar1) {
    BoxFilter::Create(in_stack_00000018,in_stack_00000010,in_stack_00000020);
    TaggedPointer<pbrt::BoxFilter>((FilterHandle *)__lhs.bits,(BoxFilter *)in_RDI);
    operator=((FilterHandle *)__lhs.bits,(FilterHandle *)in_RDI);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs.bits,(char *)in_RDI);
    if (bVar1) {
      GaussianFilter::Create(in_stack_00000058,in_stack_00000050,(Allocator)loc);
      TaggedPointer<pbrt::GaussianFilter>((FilterHandle *)__lhs.bits,in_RDI);
      operator=((FilterHandle *)__lhs.bits,(FilterHandle *)in_RDI);
      in_stack_ffffffffffffffb8 = in_R8;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs.bits,(char *)in_RDI);
      if (bVar1) {
        MitchellFilter::Create(in_stack_00000098,in_stack_00000090,in_stack_000000a0);
        TaggedPointer<pbrt::MitchellFilter>((FilterHandle *)__lhs.bits,(MitchellFilter *)in_RDI);
        operator=((FilterHandle *)__lhs.bits,(FilterHandle *)in_RDI);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs.bits,(char *)in_RDI);
        if (bVar1) {
          LanczosSincFilter::Create(in_stack_00000058,in_stack_00000050,(Allocator)loc);
          TaggedPointer<pbrt::LanczosSincFilter>
                    ((FilterHandle *)__lhs.bits,(LanczosSincFilter *)in_RDI);
          operator=((FilterHandle *)__lhs.bits,(FilterHandle *)in_RDI);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs.bits,(char *)in_RDI);
          if (!bVar1) {
            ErrorExit<std::__cxx11::string_const&>
                      (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0
                      );
          }
          TriangleFilter::Create(in_stack_00000018,in_stack_00000010,in_stack_00000020);
          TaggedPointer<pbrt::TriangleFilter>((FilterHandle *)__lhs.bits,(TriangleFilter *)in_RDI);
          operator=((FilterHandle *)__lhs.bits,(FilterHandle *)in_RDI);
        }
      }
    }
  }
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)in_RDI);
  if (bVar1) {
    ParameterDictionary::ReportUnused(in_stack_00000150);
    return (FilterHandle)
           (TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
            )__lhs.bits;
  }
  ErrorExit<std::__cxx11::string_const&>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
}

Assistant:

FilterHandle FilterHandle::Create(const std::string &name,
                                  const ParameterDictionary &parameters,
                                  const FileLoc *loc, Allocator alloc) {
    FilterHandle filter = nullptr;
    if (name == "box")
        filter = BoxFilter::Create(parameters, loc, alloc);
    else if (name == "gaussian")
        filter = GaussianFilter::Create(parameters, loc, alloc);
    else if (name == "mitchell")
        filter = MitchellFilter::Create(parameters, loc, alloc);
    else if (name == "sinc")
        filter = LanczosSincFilter::Create(parameters, loc, alloc);
    else if (name == "triangle")
        filter = TriangleFilter::Create(parameters, loc, alloc);
    else
        ErrorExit(loc, "%s: filter type unknown.", name);

    if (!filter)
        ErrorExit(loc, "%s: unable to create filter.", name);

    parameters.ReportUnused();
    return filter;
}